

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

Cluster * __thiscall mkvparser::Segment::GetNext(Segment *this,Cluster *pCurr)

{
  longlong lVar1;
  longlong lVar2;
  Cluster *pCVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  long len;
  long len_;
  longlong pos_;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  longlong local_38;
  
  lVar6 = pCurr->m_index;
  if (lVar6 < 0) {
    lVar6 = pCurr->m_element_start;
    lVar5 = this->m_size + this->m_start;
    lVar1 = GetUIntLength(this->m_pReader,lVar6,&local_58);
    if (lVar1 == 0) {
      lVar1 = ReadID(this->m_pReader,lVar6,&local_58);
      bVar7 = lVar1 == 0x1f43b675;
      if (bVar7) {
        lVar6 = lVar6 + local_58;
        GetUIntLength(this->m_pReader,lVar6,&local_58);
        lVar1 = ReadUInt(this->m_pReader,lVar6,&local_58);
        lVar6 = lVar1 + lVar6 + local_58;
        bVar7 = true;
      }
    }
    else {
      bVar7 = false;
    }
    if ((bVar7) && (lVar6 < lVar5)) {
      local_48 = 0;
      local_50 = lVar5;
      lVar1 = GetUIntLength(this->m_pReader,lVar6,&local_58);
      uVar4 = 1;
      if ((lVar1 == 0) && (lVar1 = ReadID(this->m_pReader,lVar6,&local_58), -1 < lVar1)) {
        GetUIntLength(this->m_pReader,local_58 + lVar6,&local_58);
        lVar2 = ReadUInt(this->m_pReader,local_58 + lVar6,&local_58);
        if (lVar2 == 0) {
          uVar4 = 2;
        }
        else {
          if (lVar1 == 0x1f43b675) {
            lVar6 = lVar6 - this->m_start;
            lVar5 = Cluster::HasBlockEntries(this,lVar6,&local_38,&local_40);
            if (0 < lVar5) {
              uVar4 = (uint)(0 < lVar5) * 3;
              local_48 = lVar6;
              goto LAB_00158b3d;
            }
          }
          uVar4 = 0;
        }
      }
LAB_00158b3d:
      pCVar3 = (Cluster *)(*(code *)((long)&DAT_004cc998 + (long)(int)(&DAT_004cc998)[uVar4]))();
      return pCVar3;
    }
    pCVar3 = (Cluster *)0x0;
  }
  else if (lVar6 + 1 < this->m_clusterCount) {
    pCVar3 = this->m_clusters[lVar6 + 1];
  }
  else {
    pCVar3 = &this->m_eos;
  }
  return pCVar3;
}

Assistant:

const Cluster* Segment::GetNext(const Cluster* pCurr) {
  assert(pCurr);
  assert(pCurr != &m_eos);
  assert(m_clusters);

  long idx = pCurr->m_index;

  if (idx >= 0) {
    assert(m_clusterCount > 0);
    assert(idx < m_clusterCount);
    assert(pCurr == m_clusters[idx]);

    ++idx;

    if (idx >= m_clusterCount)
      return &m_eos;  // caller will LoadCluster as desired

    Cluster* const pNext = m_clusters[idx];
    assert(pNext);
    assert(pNext->m_index >= 0);
    assert(pNext->m_index == idx);

    return pNext;
  }

  assert(m_clusterPreloadCount > 0);

  long long pos = pCurr->m_element_start;

  assert(m_size >= 0);  // TODO
  const long long stop = m_start + m_size;  // end of segment

  {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long id = ReadID(m_pReader, pos, len);
    if (id != libwebm::kMkvCluster)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size > 0);  // TODO
    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    pos += size;  // consume payload
  }

  long long off_next = 0;

  while (pos < stop) {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long idpos = pos;  // pos of next (potential) cluster

    const long long id = ReadID(m_pReader, idpos, len);
    if (id < 0)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size >= 0);  // TODO

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvCluster) {
      const long long off_next_ = idpos - m_start;

      long long pos_;
      long len_;

      const long status = Cluster::HasBlockEntries(this, off_next_, pos_, len_);

      assert(status >= 0);

      if (status > 0) {
        off_next = off_next_;
        break;
      }
    }

    pos += size;  // consume payload
  }

  if (off_next <= 0)
    return 0;

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    // const long long pos_ = pNext->m_pos;
    // assert(pos_);
    // pos = pos_ * ((pos_ < 0) ? -1 : 1);

    pos = pNext->GetPosition();

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else
      return pNext;
  }

  assert(i == j);

  Cluster* const pNext = Cluster::Create(this, -1, off_next);
  if (pNext == NULL)
    return NULL;

  const ptrdiff_t idx_next = i - m_clusters;  // insertion position

  if (!PreloadCluster(pNext, idx_next)) {
    delete pNext;
    return NULL;
  }
  assert(m_clusters);
  assert(idx_next < m_clusterSize);
  assert(m_clusters[idx_next] == pNext);

  return pNext;
}